

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O3

void VP8ParseProba(VP8BitReader *br,VP8Decoder *dec)

{
  VP8BandProbas (*paVVar1) [8];
  byte bVar2;
  range_t rVar3;
  ulong *puVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t uVar7;
  long lVar9;
  long lVar10;
  int iVar11;
  uint8_t (*paaauVar12) [8] [3] [11];
  uint8_t (*pauVar13) [11];
  uint uVar14;
  long lVar15;
  VP8BandProbas *pVVar16;
  VP8BandProbas *pVVar17;
  VP8BandProbas *pVVar18;
  VP8BandProbas *(*papVVar19) [17];
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint8_t (*paaauVar23) [8] [3] [11];
  uint8_t (*pauVar24) [11];
  uint8_t (*pauVar25) [11];
  uint8_t (*local_98) [11];
  uint32_t uVar8;
  
  paVVar1 = (dec->proba).bands;
  papVVar19 = (dec->proba).bands_ptr;
  paaauVar23 = CoeffsUpdateProba;
  paaauVar12 = CoeffsProba0;
  lVar20 = 0;
  pVVar16 = *paVVar1;
  do {
    lVar10 = 0;
    pauVar13 = (uint8_t (*) [11])paaauVar12;
    pVVar17 = pVVar16;
    pauVar24 = (uint8_t (*) [11])paaauVar23;
    do {
      lVar9 = 0;
      pVVar18 = pVVar17;
      pauVar25 = pauVar24;
      local_98 = pauVar13;
      do {
        lVar15 = 0;
        do {
          bVar2 = (*(uint8_t (*) [3] [11])*pauVar25)[0][lVar15];
          rVar3 = br->range;
          iVar11 = br->bits;
          if (iVar11 < 0) {
            puVar4 = (ulong *)br->buf;
            if (puVar4 < br->buf_max) {
              uVar5 = *puVar4;
              br->buf = (uint8_t *)((long)puVar4 + 7);
              br->value = br->value << 0x38 |
                          ((uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
                           (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
                           (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) >>
                          8;
              iVar11 = iVar11 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar11 = br->bits;
            }
          }
          uVar21 = bVar2 * rVar3 >> 8;
          uVar14 = (uint)(br->value >> ((byte)iVar11 & 0x3f));
          if (uVar21 < uVar14) {
            uVar22 = rVar3 - uVar21;
            br->value = br->value - ((ulong)uVar21 + 1 << ((byte)iVar11 & 0x3f));
          }
          else {
            uVar22 = uVar21 + 1;
          }
          uVar6 = 0x1f;
          if (uVar22 != 0) {
            for (; uVar22 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          br->bits = iVar11 - (uVar6 ^ 7);
          br->range = (uVar22 << ((byte)(uVar6 ^ 7) & 0x1f)) - 1;
          if (uVar21 < uVar14) {
            uVar8 = VP8GetValue(br,8);
            uVar7 = (uint8_t)uVar8;
          }
          else {
            uVar7 = (*(uint8_t (*) [3] [11])*local_98)[0][lVar15];
          }
          (*(VP8BandProbas (*) [8])pVVar18)[0].probas[0][lVar15] = uVar7;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xb);
        lVar9 = lVar9 + 1;
        pauVar25 = pauVar25 + 1;
        local_98 = local_98 + 1;
        pVVar18 = (VP8BandProbas *)((*(VP8BandProbas (*) [8])pVVar18)[0].probas + 1);
      } while (lVar9 != 3);
      lVar10 = lVar10 + 1;
      pauVar24 = pauVar24 + 3;
      pauVar13 = pauVar13 + 3;
      pVVar17 = pVVar17 + 1;
    } while (lVar10 != 8);
    lVar10 = 0;
    do {
      (*papVVar19)[lVar10] =
           (VP8BandProbas *)
           ((long)paVVar1[lVar20][0].probas + (ulong)""[lVar10] * 0x20 + (ulong)""[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x11);
    lVar20 = lVar20 + 1;
    paaauVar23 = (uint8_t (*) [8] [3] [11])((long)paaauVar23 + 0x108);
    paaauVar12 = (uint8_t (*) [8] [3] [11])((long)paaauVar12 + 0x108);
    pVVar16 = pVVar16 + 8;
    papVVar19 = papVVar19 + 1;
  } while (lVar20 != 4);
  uVar8 = VP8GetValue(br,1);
  dec->use_skip_proba = uVar8;
  if (uVar8 != 0) {
    uVar8 = VP8GetValue(br,8);
    dec->skip_p = (uint8_t)uVar8;
  }
  return;
}

Assistant:

void VP8ParseProba(VP8BitReader* const br, VP8Decoder* const dec) {
  VP8Proba* const proba = &dec->proba;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const int v =
              VP8GetBit(br, CoeffsUpdateProba[t][b][c][p], "global-header") ?
                        VP8GetValue(br, 8, "global-header") :
                        CoeffsProba0[t][b][c][p];
          proba->bands[t][b].probas[c][p] = v;
        }
      }
    }
    for (b = 0; b < 16 + 1; ++b) {
      proba->bands_ptr[t][b] = &proba->bands[t][kBands[b]];
    }
  }
  dec->use_skip_proba = VP8Get(br, "global-header");
  if (dec->use_skip_proba) {
    dec->skip_p = VP8GetValue(br, 8, "global-header");
  }
}